

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O1

void __thiscall IRBuilderAsmJs::BuildConstantLoads(IRBuilderAsmJs *this)

{
  float value;
  FloatConstType value_00;
  Opnd *this_00;
  StackSym *this_01;
  undefined8 uVar1;
  int64 value_01;
  code *pcVar2;
  undefined4 uVar3;
  Type TVar4;
  undefined4 *puVar5;
  bool bVar6;
  OpndKind OVar7;
  ValueType VVar8;
  RegSlot RVar9;
  uint uVar10;
  JITTimeFunctionBody *pJVar11;
  void *pvVar12;
  RegOpnd *pRVar13;
  Instr *pIVar14;
  long value_02;
  IntConstOpnd *src1Opnd;
  ulong uVar15;
  void *pvVar16;
  Simd128ConstOpnd *pSVar17;
  Float32ConstOpnd *src1Opnd_00;
  FloatConstOpnd *src1Opnd_01;
  Int64ConstOpnd *src1Opnd_02;
  Func *in_R8;
  int iVar18;
  ulong uVar19;
  RegSlot dstRegSlot;
  ulong uVar20;
  Types type;
  undefined1 *puVar21;
  undefined8 *puVar22;
  long lVar23;
  AsmJsSIMDValue value_03;
  undefined1 local_80 [8];
  TypedSlotInfo info;
  
  pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  pvVar12 = JITTimeFunctionBody::GetConstTable(pJVar11);
  pRVar13 = BuildDstOpnd(this,1,TyVar);
  pIVar14 = IR::Instr::New(LdAsmJsEnv,&pRVar13->super_Opnd,this->m_func);
  AddInstr(this,pIVar14,0xffffffff);
  bVar6 = AsmJsJITInfo::UsesHeapBuffer(this->m_asmFuncInfo);
  if (bVar6) {
    BuildHeapBufferReload(this,0xffffffff,true);
  }
  if (pvVar12 != (void *)0x0) {
    register0x00000000 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    dstRegSlot = 8;
    type = INT32;
    do {
      puVar5 = stack0xffffffffffffff98;
      AsmJsJITInfo::GetTypedSlotInfo((TypedSlotInfo *)local_80,this->m_asmFuncInfo,type);
      TVar4 = info.tmpCount;
      uVar3 = local_80._0_4_;
      uVar19 = (ulong)(uint)local_80._0_4_;
      info.byteOffset = type;
      if (uVar19 == 0) goto LAB_004f9715;
      switch(type) {
      case INT32:
        uVar20 = (ulong)info.tmpCount;
        VVar8 = ValueType::GetInt(false);
        pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        RVar9 = JITTimeFunctionBody::GetConstCount(pJVar11);
        if (0x1fffffff < RVar9) {
LAB_004f973b:
          Math::DefaultOverflowPolicy();
        }
        if (RVar9 << 3 <= TVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                             ,0x314,
                             "(byteOffset < UInt32Math::Mul<sizeof(Js::Var)>(m_func->GetJITFunctionBody()->GetConstCount()))"
                             ,
                             "byteOffset < UInt32Math::Mul<sizeof(Js::Var)>(m_func->GetJITFunctionBody()->GetConstCount())"
                            );
          if (!bVar6) goto LAB_004f9739;
          *puVar5 = 0;
        }
        if (0x3fffffff < (uint)uVar3) goto LAB_004f973b;
        uVar20 = uVar20 + (long)pvVar12;
        puVar21 = (undefined1 *)(uVar19 * 4 + uVar20);
        if (CARRY8(uVar19 * 4,uVar20)) {
          puVar21 = &DAT_ffffffffffffffff;
        }
        pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        pvVar16 = JITTimeFunctionBody::GetConstTable(pJVar11);
        pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        RVar9 = JITTimeFunctionBody::GetConstCount(pJVar11);
        if ((undefined1 *)((long)pvVar16 + (ulong)RVar9 * 8) < puVar21) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                             ,0x315,
                             "(AllocSizeMath::Add((size_t)typedTable, UInt32Math::Mul<sizeof(T)>(constCount)) <= (size_t)((Js::Var*)m_func->GetJITFunctionBody()->GetConstTable() + m_func->GetJITFunctionBody()->GetConstCount()))"
                             ,
                             "AllocSizeMath::Add((size_t)typedTable, UInt32Math::Mul<sizeof(T)>(constCount)) <= (size_t)((Js::Var*)m_func->GetJITFunctionBody()->GetConstTable() + m_func->GetJITFunctionBody()->GetConstCount())"
                            );
          if (!bVar6) goto LAB_004f9739;
          *puVar5 = 0;
        }
        if (uVar3 == 1) goto LAB_004f95e3;
        lVar23 = 1;
        do {
          value_02 = (long)*(int *)(uVar20 + lVar23 * 4);
          pRVar13 = BuildDstOpnd(this,dstRegSlot + (int)lVar23,TyInt32);
          uVar10 = dstRegSlot + (int)lVar23;
          if ((uVar10 == 0) || (this->m_firstsType[5] <= uVar10)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = stack0xffffffffffffff98;
            *stack0xffffffffffffff98 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                               ,799,"(RegIsConstant(reg))","RegIsConstant(reg)");
            if (!bVar6) goto LAB_004f9739;
            *puVar5 = 0;
          }
          puVar21 = &pRVar13->m_sym->field_0x18;
          *(uint *)puVar21 = *(uint *)puVar21 | 0x40000;
          IR::Opnd::SetValueType(&pRVar13->super_Opnd,VVar8);
          src1Opnd = IR::IntConstOpnd::New(value_02,TyInt32,this->m_func,false);
          pIVar14 = IR::Instr::New(Ld_I4,&pRVar13->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
          this_00 = pIVar14->m_dst;
          OVar7 = IR::Opnd::GetKind(this_00);
          if (OVar7 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = stack0xffffffffffffff98;
            *stack0xffffffffffffff98 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
            if (!bVar6) goto LAB_004f9739;
            *puVar5 = 0;
          }
          this_01 = (StackSym *)this_00[1]._vptr_Opnd;
          if (((this_01->field_0x18 & 1) != 0) && ((this_01->field_5).m_instrDef != (Instr *)0x0)) {
            StackSym::SetIsIntConst(this_01,value_02);
          }
          AddInstr(this,pIVar14,0xffffffff);
          lVar23 = lVar23 + 1;
        } while (uVar3 != (uint)lVar23);
LAB_004f9712:
        dstRegSlot = dstRegSlot + (int)lVar23;
        break;
      case INT64:
        uVar20 = (ulong)info.tmpCount;
        VVar8 = ValueType::GetInt(false);
        pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        RVar9 = JITTimeFunctionBody::GetConstCount(pJVar11);
        if (0x1fffffff < RVar9) goto LAB_004f973b;
        if (RVar9 << 3 <= TVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                             ,0x314,
                             "(byteOffset < UInt32Math::Mul<sizeof(Js::Var)>(m_func->GetJITFunctionBody()->GetConstCount()))"
                             ,
                             "byteOffset < UInt32Math::Mul<sizeof(Js::Var)>(m_func->GetJITFunctionBody()->GetConstCount())"
                            );
          if (!bVar6) goto LAB_004f9739;
          *puVar5 = 0;
        }
        if (0x1fffffff < (uint)uVar3) goto LAB_004f973b;
        uVar20 = uVar20 + (long)pvVar12;
        puVar21 = (undefined1 *)(uVar19 * 8 + uVar20);
        if (CARRY8(uVar19 * 8,uVar20)) {
          puVar21 = &DAT_ffffffffffffffff;
        }
        pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        pvVar16 = JITTimeFunctionBody::GetConstTable(pJVar11);
        pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        RVar9 = JITTimeFunctionBody::GetConstCount(pJVar11);
        if ((undefined1 *)((long)pvVar16 + (ulong)RVar9 * 8) < puVar21) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                             ,0x315,
                             "(AllocSizeMath::Add((size_t)typedTable, UInt32Math::Mul<sizeof(T)>(constCount)) <= (size_t)((Js::Var*)m_func->GetJITFunctionBody()->GetConstTable() + m_func->GetJITFunctionBody()->GetConstCount()))"
                             ,
                             "AllocSizeMath::Add((size_t)typedTable, UInt32Math::Mul<sizeof(T)>(constCount)) <= (size_t)((Js::Var*)m_func->GetJITFunctionBody()->GetConstTable() + m_func->GetJITFunctionBody()->GetConstCount())"
                            );
          if (!bVar6) goto LAB_004f9739;
          *puVar5 = 0;
        }
        if (uVar3 != 1) {
          lVar23 = 1;
          do {
            value_01 = *(int64 *)(uVar20 + lVar23 * 8);
            pRVar13 = BuildDstOpnd(this,dstRegSlot + (int)lVar23,TyInt64);
            uVar10 = dstRegSlot + (int)lVar23;
            if ((uVar10 == 0) || (this->m_firstsType[5] <= uVar10)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar5 = stack0xffffffffffffff98;
              *stack0xffffffffffffff98 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                                 ,799,"(RegIsConstant(reg))","RegIsConstant(reg)");
              if (!bVar6) goto LAB_004f9739;
              *puVar5 = 0;
            }
            puVar21 = &pRVar13->m_sym->field_0x18;
            *(uint *)puVar21 = *(uint *)puVar21 | 0x40000;
            IR::Opnd::SetValueType(&pRVar13->super_Opnd,VVar8);
            src1Opnd_02 = IR::Int64ConstOpnd::New(value_01,TyInt64,this->m_func);
            pIVar14 = IR::Instr::New(Ld_I4,&pRVar13->super_Opnd,&src1Opnd_02->super_Opnd,
                                     this->m_func);
            AddInstr(this,pIVar14,0xffffffff);
            lVar23 = lVar23 + 1;
          } while (uVar3 != (uint)lVar23);
          goto LAB_004f9712;
        }
        goto LAB_004f95e3;
      case FLOAT32:
        uVar20 = (ulong)info.tmpCount;
        pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        RVar9 = JITTimeFunctionBody::GetConstCount(pJVar11);
        if (0x1fffffff < RVar9) goto LAB_004f973b;
        if (RVar9 << 3 <= TVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                             ,0x314,
                             "(byteOffset < UInt32Math::Mul<sizeof(Js::Var)>(m_func->GetJITFunctionBody()->GetConstCount()))"
                             ,
                             "byteOffset < UInt32Math::Mul<sizeof(Js::Var)>(m_func->GetJITFunctionBody()->GetConstCount())"
                            );
          if (!bVar6) goto LAB_004f9739;
          *puVar5 = 0;
        }
        if (0x3fffffff < (uint)uVar3) goto LAB_004f973b;
        uVar20 = uVar20 + (long)pvVar12;
        puVar21 = (undefined1 *)(uVar19 * 4 + uVar20);
        if (CARRY8(uVar19 * 4,uVar20)) {
          puVar21 = &DAT_ffffffffffffffff;
        }
        pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        pvVar16 = JITTimeFunctionBody::GetConstTable(pJVar11);
        pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        RVar9 = JITTimeFunctionBody::GetConstCount(pJVar11);
        if ((undefined1 *)((long)pvVar16 + (ulong)RVar9 * 8) < puVar21) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                             ,0x315,
                             "(AllocSizeMath::Add((size_t)typedTable, UInt32Math::Mul<sizeof(T)>(constCount)) <= (size_t)((Js::Var*)m_func->GetJITFunctionBody()->GetConstTable() + m_func->GetJITFunctionBody()->GetConstCount()))"
                             ,
                             "AllocSizeMath::Add((size_t)typedTable, UInt32Math::Mul<sizeof(T)>(constCount)) <= (size_t)((Js::Var*)m_func->GetJITFunctionBody()->GetConstTable() + m_func->GetJITFunctionBody()->GetConstCount())"
                            );
          if (!bVar6) goto LAB_004f9739;
          *puVar5 = 0;
        }
        if (uVar3 == 1) goto LAB_004f95e3;
        lVar23 = 1;
        do {
          value = *(float *)(uVar20 + lVar23 * 4);
          pRVar13 = BuildDstOpnd(this,dstRegSlot + (int)lVar23,TyFloat32);
          uVar10 = dstRegSlot + (int)lVar23;
          if ((uVar10 == 0) || (this->m_firstsType[5] <= uVar10)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar5 = stack0xffffffffffffff98;
            *stack0xffffffffffffff98 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                               ,799,"(RegIsConstant(reg))","RegIsConstant(reg)");
            if (!bVar6) goto LAB_004f9739;
            *puVar5 = 0;
          }
          puVar21 = &pRVar13->m_sym->field_0x18;
          *(uint *)puVar21 = *(uint *)puVar21 | 0x40000;
          IR::Opnd::SetValueType(&pRVar13->super_Opnd,(ValueType)0x108);
          src1Opnd_00 = IR::Float32ConstOpnd::New(value,TyFloat32,this->m_func);
          pIVar14 = IR::Instr::New(LdC_F8_R8,&pRVar13->super_Opnd,&src1Opnd_00->super_Opnd,
                                   this->m_func);
          AddInstr(this,pIVar14,0xffffffff);
          lVar23 = lVar23 + 1;
        } while (uVar3 != (uint)lVar23);
LAB_004f94a3:
        dstRegSlot = dstRegSlot + (int)lVar23;
        break;
      case FLOAT64:
        uVar20 = (ulong)info.tmpCount;
        pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        RVar9 = JITTimeFunctionBody::GetConstCount(pJVar11);
        if (0x1fffffff < RVar9) goto LAB_004f973b;
        if (RVar9 << 3 <= TVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                             ,0x314,
                             "(byteOffset < UInt32Math::Mul<sizeof(Js::Var)>(m_func->GetJITFunctionBody()->GetConstCount()))"
                             ,
                             "byteOffset < UInt32Math::Mul<sizeof(Js::Var)>(m_func->GetJITFunctionBody()->GetConstCount())"
                            );
          if (!bVar6) goto LAB_004f9739;
          *puVar5 = 0;
        }
        if (0x1fffffff < (uint)uVar3) goto LAB_004f973b;
        uVar20 = uVar20 + (long)pvVar12;
        puVar21 = (undefined1 *)(uVar19 * 8 + uVar20);
        if (CARRY8(uVar19 * 8,uVar20)) {
          puVar21 = &DAT_ffffffffffffffff;
        }
        pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        pvVar16 = JITTimeFunctionBody::GetConstTable(pJVar11);
        pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        RVar9 = JITTimeFunctionBody::GetConstCount(pJVar11);
        if ((undefined1 *)((long)pvVar16 + (ulong)RVar9 * 8) < puVar21) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                             ,0x315,
                             "(AllocSizeMath::Add((size_t)typedTable, UInt32Math::Mul<sizeof(T)>(constCount)) <= (size_t)((Js::Var*)m_func->GetJITFunctionBody()->GetConstTable() + m_func->GetJITFunctionBody()->GetConstCount()))"
                             ,
                             "AllocSizeMath::Add((size_t)typedTable, UInt32Math::Mul<sizeof(T)>(constCount)) <= (size_t)((Js::Var*)m_func->GetJITFunctionBody()->GetConstTable() + m_func->GetJITFunctionBody()->GetConstCount())"
                            );
          if (!bVar6) goto LAB_004f9739;
          *puVar5 = 0;
        }
        if (uVar3 != 1) {
          lVar23 = 1;
          do {
            value_00 = *(FloatConstType *)(uVar20 + lVar23 * 8);
            pRVar13 = BuildDstOpnd(this,dstRegSlot + (int)lVar23,TyFloat64);
            uVar10 = dstRegSlot + (int)lVar23;
            if ((uVar10 == 0) || (this->m_firstsType[5] <= uVar10)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar5 = stack0xffffffffffffff98;
              *stack0xffffffffffffff98 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                                 ,799,"(RegIsConstant(reg))","RegIsConstant(reg)");
              if (!bVar6) goto LAB_004f9739;
              *puVar5 = 0;
            }
            puVar21 = &pRVar13->m_sym->field_0x18;
            *(uint *)puVar21 = *(uint *)puVar21 | 0x40000;
            IR::Opnd::SetValueType(&pRVar13->super_Opnd,(ValueType)0x108);
            src1Opnd_01 = IR::FloatConstOpnd::New(value_00,TyFloat64,this->m_func);
            pIVar14 = IR::Instr::New(LdC_F8_R8,&pRVar13->super_Opnd,&src1Opnd_01->super_Opnd,
                                     this->m_func);
            AddInstr(this,pIVar14,0xffffffff);
            lVar23 = lVar23 + 1;
          } while (uVar3 != (uint)lVar23);
          goto LAB_004f94a3;
        }
LAB_004f95e3:
        dstRegSlot = dstRegSlot + 1;
        break;
      case SIMD:
        uVar20 = (ulong)info.tmpCount;
        pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        RVar9 = JITTimeFunctionBody::GetConstCount(pJVar11);
        if (0x1fffffff < RVar9) goto LAB_004f973b;
        if (RVar9 << 3 <= TVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                             ,0x314,
                             "(byteOffset < UInt32Math::Mul<sizeof(Js::Var)>(m_func->GetJITFunctionBody()->GetConstCount()))"
                             ,
                             "byteOffset < UInt32Math::Mul<sizeof(Js::Var)>(m_func->GetJITFunctionBody()->GetConstCount())"
                            );
          if (!bVar6) goto LAB_004f9739;
          *puVar5 = 0;
        }
        if (0xfffffff < (uint)uVar3) goto LAB_004f973b;
        uVar15 = (long)pvVar12 + uVar20;
        puVar21 = (undefined1 *)(uVar19 * 0x10 + uVar15);
        if (CARRY8(uVar19 * 0x10,uVar15)) {
          puVar21 = &DAT_ffffffffffffffff;
        }
        pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        pvVar16 = JITTimeFunctionBody::GetConstTable(pJVar11);
        pJVar11 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
        RVar9 = JITTimeFunctionBody::GetConstCount(pJVar11);
        if ((undefined1 *)((long)pvVar16 + (ulong)RVar9 * 8) < puVar21) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                             ,0x315,
                             "(AllocSizeMath::Add((size_t)typedTable, UInt32Math::Mul<sizeof(T)>(constCount)) <= (size_t)((Js::Var*)m_func->GetJITFunctionBody()->GetConstTable() + m_func->GetJITFunctionBody()->GetConstCount()))"
                             ,
                             "AllocSizeMath::Add((size_t)typedTable, UInt32Math::Mul<sizeof(T)>(constCount)) <= (size_t)((Js::Var*)m_func->GetJITFunctionBody()->GetConstTable() + m_func->GetJITFunctionBody()->GetConstCount())"
                            );
          if (!bVar6) goto LAB_004f9739;
          *puVar5 = 0;
        }
        dstRegSlot = dstRegSlot + 1;
        if (uVar3 != 1) {
          puVar22 = (undefined8 *)((long)pvVar12 + uVar20 + 0x18);
          iVar18 = uVar3 - 1;
          do {
            pSVar17 = (Simd128ConstOpnd *)puVar22[-1];
            uVar1 = *puVar22;
            pRVar13 = BuildDstOpnd(this,dstRegSlot,TySimd128F4);
            if ((dstRegSlot == 0) || (this->m_firstsType[5] <= dstRegSlot)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar5 = stack0xffffffffffffff98;
              *stack0xffffffffffffff98 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                                 ,799,"(RegIsConstant(reg))","RegIsConstant(reg)");
              if (!bVar6) goto LAB_004f9739;
              *puVar5 = 0;
            }
            puVar21 = &pRVar13->m_sym->field_0x18;
            *(uint *)puVar21 = *(uint *)puVar21 | 0x40000;
            IR::Opnd::SetValueType(&pRVar13->super_Opnd,(ValueType)0x10);
            value_03.field_0.f64[1] = 5.43472210425371e-323;
            value_03.field_0.f64[0] = (Type)uVar1;
            pSVar17 = IR::Simd128ConstOpnd::New(pSVar17,value_03,(IRType)this->m_func,in_R8);
            pIVar14 = IR::Instr::New(Simd128_LdC,&pRVar13->super_Opnd,&pSVar17->super_Opnd,
                                     this->m_func);
            AddInstr(this,pIVar14,0xffffffff);
            puVar22 = puVar22 + 2;
            dstRegSlot = dstRegSlot + 1;
            iVar18 = iVar18 + -1;
          } while (iVar18 != 0);
        }
        break;
      default:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                           ,0x3ab,"(false)","false");
        if (!bVar6) {
LAB_004f9739:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
LAB_004f9715:
      type = info.byteOffset + INT64;
    } while (type != LIMIT);
  }
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildConstantLoads()
{
    Js::Var * constTable = (Js::Var *)m_func->GetJITFunctionBody()->GetConstTable();
    // Load FrameDisplay
    IR::RegOpnd * asmJsEnvDstOpnd = BuildDstOpnd(AsmJsRegSlots::ModuleMemReg, TyVar);
    IR::Instr * ldAsmJsEnvInstr = IR::Instr::New(Js::OpCode::LdAsmJsEnv, asmJsEnvDstOpnd, m_func);
    AddInstr(ldAsmJsEnvInstr, Js::Constants::NoByteCodeOffset);
    // Load heap buffer
    if (m_asmFuncInfo->UsesHeapBuffer())
    {
        BuildHeapBufferReload(Js::Constants::NoByteCodeOffset, true);
    }
    if (!constTable)
    {
        return;
    }

    uint32 regAllocated = AsmJsRegSlots::RegCount;
    byte* table = (byte*)constTable;
    const bool isOOPJIT = m_func->IsOOPJIT();
    for (int i = 0; i < WAsmJs::LIMIT; ++i)
    {
        WAsmJs::Types type = (WAsmJs::Types)i;
        WAsmJs::TypedSlotInfo info = m_asmFuncInfo->GetTypedSlotInfo(type);
        if (info.constCount == 0)
        {
            continue;
        }

        switch(type)
        {
        case WAsmJs::INT32:
            CreateLoadConstInstrForType<int32, IR::IntConstOpnd>(
                table,
                regAllocated,
                info.constCount,
                info.constSrcByteOffset,
                TyInt32,
                ValueType::GetInt(false),
                Js::OpCode::Ld_I4,
                [isOOPJIT](IR::Instr* instr, int32 val)
                {
                    IR::RegOpnd* dstOpnd = instr->GetDst()->AsRegOpnd();
                    if (!isOOPJIT && dstOpnd->m_sym->IsSingleDef())
                    {
                        dstOpnd->m_sym->SetIsIntConst(val);
                    }
                }
            );
            break;
#if TARGET_64
        case WAsmJs::INT64:
            CreateLoadConstInstrForType<int64, IR::Int64ConstOpnd>(
                table,
                regAllocated,
                info.constCount,
                info.constSrcByteOffset,
                TyInt64,
                ValueType::GetInt(false),
                Js::OpCode::Ld_I4,
                [&](IR::Instr* instr, int64 val) {}
            );
            break;
#endif
        case WAsmJs::FLOAT32:
            CreateLoadConstInstrForType<float, IR::Float32ConstOpnd>(
                table,
                regAllocated,
                info.constCount,
                info.constSrcByteOffset,
                TyFloat32,
                ValueType::Float,
                Js::OpCode::LdC_F8_R8,
                [isOOPJIT](IR::Instr* instr, float val)
            {
#if _M_IX86
                IR::RegOpnd* dstOpnd = instr->GetDst()->AsRegOpnd();
                if (!isOOPJIT && dstOpnd->m_sym->IsSingleDef())
                {
                    dstOpnd->m_sym->SetIsFloatConst();
                }
#endif
            }
            );
            break;
        case WAsmJs::FLOAT64:
            CreateLoadConstInstrForType<double, IR::FloatConstOpnd>(
                table,
                regAllocated,
                info.constCount,
                info.constSrcByteOffset,
                TyFloat64,
                ValueType::Float,
                Js::OpCode::LdC_F8_R8,
                [isOOPJIT](IR::Instr* instr, double val)
                {
#if _M_IX86
                    IR::RegOpnd* dstOpnd = instr->GetDst()->AsRegOpnd();
                    if (!isOOPJIT && dstOpnd->m_sym->IsSingleDef())
                    {
                        dstOpnd->m_sym->SetIsFloatConst();
                    }
#endif
                }
            );
            break;
        case WAsmJs::SIMD:
            CreateLoadConstInstrForType<AsmJsSIMDValue, IR::Simd128ConstOpnd>(
                table,
                regAllocated,
                info.constCount,
                info.constSrcByteOffset,
                TySimd128F4,
                ValueType::UninitializedObject,
                Js::OpCode::Simd128_LdC,
                [isOOPJIT](IR::Instr* instr, AsmJsSIMDValue val)
                {
#if _M_IX86
                    IR::RegOpnd* dstOpnd = instr->GetDst()->AsRegOpnd();
                    if (!isOOPJIT && dstOpnd->m_sym->IsSingleDef())
                    {
                        dstOpnd->m_sym->SetIsSimd128Const();
                    }
#endif
                }
            );
            break;
        default:
            Assert(false);
            break;
        }
    }
}